

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainReal.c
# Opt level: O3

int Abc_RealMain(int argc,char **argv)

{
  char cVar1;
  size_t sVar2;
  char **__size;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  Vec_Str_t *p;
  char *pcVar11;
  Abc_Frame_t *pAbc;
  size_t sVar12;
  char *pcVar13;
  Gia_Man_t *pGVar14;
  ulong uVar15;
  char **format;
  __rlimit_resource_t __resource;
  char **ppcVar16;
  int i;
  long lVar17;
  char sWriteCmd [1000];
  char sReadCmd [1000];
  char sCommandTmp [32768];
  char *local_8820;
  char local_8818 [1008];
  char local_8428 [1008];
  rlimit local_8038 [2048];
  
  p = (Vec_Str_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  pcVar11 = (char *)malloc(1000);
  p->pArray = pcVar11;
  pAbc = Abc_FrameGetGlobalFrame();
  pAbc->sBinary = *argv;
  builtin_strncpy(local_8428,"read",5);
  builtin_strncpy(local_8818,"write",6);
  Extra_UtilGetoptReset();
  bVar4 = false;
  bVar5 = false;
  iVar8 = 0;
  local_8820 = (char *)0x0;
  bVar6 = true;
switchD_001c9f22_caseD_73:
  while( true ) {
    while( true ) {
      bVar3 = bVar6;
      format = argv;
      iVar9 = argc;
      iVar7 = Extra_UtilGetopt(argc,argv,"dm:l:c:q:C:Q:S:hf:F:o:st:T:xb");
      bVar6 = bVar3;
      if (0x52 < iVar7) goto code_r0x001c9f12;
      if (iVar7 < 0x46) break;
      if (iVar7 == 0x46) {
        iVar8 = p->nSize;
        if (0 < iVar8) {
          lVar17 = 0;
          while( true ) {
            cVar1 = " ; "[lVar17];
            if (iVar8 == p->nCap) {
              if (iVar8 < 0x10) {
                if (p->pArray == (char *)0x0) {
                  pcVar11 = (char *)malloc(0x10);
                }
                else {
                  pcVar11 = (char *)realloc(p->pArray,0x10);
                }
                p->pArray = pcVar11;
                p->nCap = 0x10;
              }
              else {
                uVar10 = iVar8 * 2;
                if (p->pArray == (char *)0x0) {
                  pcVar11 = (char *)malloc((ulong)uVar10);
                }
                else {
                  pcVar11 = (char *)realloc(p->pArray,(ulong)uVar10);
                }
                p->pArray = pcVar11;
                p->nCap = uVar10;
              }
            }
            else {
              pcVar11 = p->pArray;
            }
            iVar8 = p->nSize;
            p->nSize = iVar8 + 1;
            pcVar11[iVar8] = cVar1;
            if (lVar17 == 2) break;
            iVar8 = p->nSize;
            lVar17 = lVar17 + 1;
          }
        }
        pcVar11 = "source -x %s";
        goto LAB_001ca79a;
      }
      if (iVar7 != 0x51) goto switchD_001c9f22_caseD_65;
      iVar8 = p->nSize;
      if (0 < iVar8) {
        lVar17 = 0;
        while( true ) {
          cVar1 = " ; "[lVar17];
          if (iVar8 == p->nCap) {
            if (iVar8 < 0x10) {
              if (p->pArray == (char *)0x0) {
                pcVar11 = (char *)malloc(0x10);
              }
              else {
                pcVar11 = (char *)realloc(p->pArray,0x10);
              }
              p->pArray = pcVar11;
              p->nCap = 0x10;
            }
            else {
              uVar10 = iVar8 * 2;
              if (p->pArray == (char *)0x0) {
                pcVar11 = (char *)malloc((ulong)uVar10);
              }
              else {
                pcVar11 = (char *)realloc(p->pArray,(ulong)uVar10);
              }
              p->pArray = pcVar11;
              p->nCap = uVar10;
            }
          }
          else {
            pcVar11 = p->pArray;
          }
          iVar8 = p->nSize;
          p->nSize = iVar8 + 1;
          pcVar11[iVar8] = cVar1;
          if (lVar17 == 2) break;
          iVar8 = p->nSize;
          lVar17 = lVar17 + 1;
        }
      }
      pcVar11 = globalUtilOptarg;
      sVar12 = strlen(globalUtilOptarg);
      iVar8 = 4;
      if (0 < (int)(uint)sVar12) {
        uVar15 = 0;
        do {
          cVar1 = pcVar11[uVar15];
          uVar10 = p->nSize;
          if (uVar10 == p->nCap) {
            if ((int)uVar10 < 0x10) {
              if (p->pArray == (char *)0x0) {
                pcVar13 = (char *)malloc(0x10);
              }
              else {
                pcVar13 = (char *)realloc(p->pArray,0x10);
              }
              p->pArray = pcVar13;
              p->nCap = 0x10;
            }
            else {
              sVar2 = (ulong)uVar10 * 2;
              if (p->pArray == (char *)0x0) {
                pcVar13 = (char *)malloc(sVar2);
              }
              else {
                pcVar13 = (char *)realloc(p->pArray,sVar2);
              }
              p->pArray = pcVar13;
              p->nCap = (int)sVar2;
            }
          }
          else {
            pcVar13 = p->pArray;
          }
          iVar9 = p->nSize;
          p->nSize = iVar9 + 1;
          pcVar13[iVar9] = cVar1;
          uVar15 = uVar15 + 1;
        } while (((uint)sVar12 & 0x7fffffff) != uVar15);
      }
    }
    if (iVar7 != 0x43) break;
    iVar8 = p->nSize;
    if (0 < iVar8) {
      lVar17 = 0;
      while( true ) {
        cVar1 = " ; "[lVar17];
        if (iVar8 == p->nCap) {
          if (iVar8 < 0x10) {
            if (p->pArray == (char *)0x0) {
              pcVar11 = (char *)malloc(0x10);
            }
            else {
              pcVar11 = (char *)realloc(p->pArray,0x10);
            }
            p->pArray = pcVar11;
            p->nCap = 0x10;
          }
          else {
            uVar10 = iVar8 * 2;
            if (p->pArray == (char *)0x0) {
              pcVar11 = (char *)malloc((ulong)uVar10);
            }
            else {
              pcVar11 = (char *)realloc(p->pArray,(ulong)uVar10);
            }
            p->pArray = pcVar11;
            p->nCap = uVar10;
          }
        }
        else {
          pcVar11 = p->pArray;
        }
        iVar8 = p->nSize;
        p->nSize = iVar8 + 1;
        pcVar11[iVar8] = cVar1;
        if (lVar17 == 2) break;
        iVar8 = p->nSize;
        lVar17 = lVar17 + 1;
      }
    }
    pcVar11 = globalUtilOptarg;
    sVar12 = strlen(globalUtilOptarg);
    iVar8 = 2;
    if (0 < (int)(uint)sVar12) {
      uVar15 = 0;
      do {
        cVar1 = pcVar11[uVar15];
        uVar10 = p->nSize;
        if (uVar10 == p->nCap) {
          if ((int)uVar10 < 0x10) {
            if (p->pArray == (char *)0x0) {
              pcVar13 = (char *)malloc(0x10);
            }
            else {
              pcVar13 = (char *)realloc(p->pArray,0x10);
            }
            p->pArray = pcVar13;
            p->nCap = 0x10;
          }
          else {
            sVar2 = (ulong)uVar10 * 2;
            if (p->pArray == (char *)0x0) {
              pcVar13 = (char *)malloc(sVar2);
            }
            else {
              pcVar13 = (char *)realloc(p->pArray,sVar2);
            }
            p->pArray = pcVar13;
            p->nCap = (int)sVar2;
          }
        }
        else {
          pcVar13 = p->pArray;
        }
        iVar9 = p->nSize;
        p->nSize = iVar9 + 1;
        pcVar13[iVar9] = cVar1;
        uVar15 = uVar15 + 1;
      } while (((uint)sVar12 & 0x7fffffff) != uVar15);
    }
  }
  if (iVar7 == -1) {
    uVar10 = p->nSize;
    if (uVar10 == p->nCap) {
      if ((int)uVar10 < 0x10) {
        pcVar13 = p->pArray;
        if (pcVar13 == (char *)0x0) {
          iVar9 = 0x10;
          pcVar11 = (char *)malloc(0x10);
        }
        else {
          format = (char **)&DAT_00000010;
          pcVar11 = (char *)realloc(pcVar13,0x10);
          iVar9 = (int)pcVar13;
        }
        p->pArray = pcVar11;
        p->nCap = 0x10;
      }
      else {
        __size = (char **)((ulong)uVar10 * 2);
        pcVar13 = p->pArray;
        if (pcVar13 == (char *)0x0) {
          ppcVar16 = __size;
          pcVar11 = (char *)malloc((size_t)__size);
          iVar9 = (int)ppcVar16;
        }
        else {
          format = __size;
          pcVar11 = (char *)realloc(pcVar13,(size_t)__size);
          iVar9 = (int)pcVar13;
        }
        p->pArray = pcVar11;
        p->nCap = (int)__size;
      }
    }
    else {
      pcVar11 = p->pArray;
    }
    iVar7 = p->nSize;
    p->nSize = iVar7 + 1;
    pcVar11[iVar7] = '\0';
    if (iVar8 == 5) {
      Wlc_StdinProcessSmt(pAbc,p->pArray);
      goto LAB_001cac23;
    }
    iVar7 = Abc_FrameIsBridgeMode();
    if (iVar7 == 0) {
      if (iVar8 - 3U < 2) goto LAB_001caa8f;
      if (iVar8 != 0) {
        if (0 < p->nSize) {
          Abc_Print(iVar9,(char *)format,p->pArray);
        }
        goto LAB_001caa7c;
      }
    }
    else {
      pGVar14 = Gia_ManFromBridge((FILE *)_stdin,(Vec_Int_t **)0x0);
      pAbc->pGia = pGVar14;
LAB_001caa7c:
      if (iVar8 != 0) {
LAB_001caa8f:
        pAbc->fBatchMode = 1;
        if (argc == globalUtilOptind) {
LAB_001caae0:
          pcVar11 = (char *)0x0;
        }
        else {
          if (argc - globalUtilOptind != 1) {
            Abc_UtilsPrintUsage(pAbc,*argv);
            goto LAB_001caae0;
          }
          pcVar11 = argv[globalUtilOptind];
          bVar4 = true;
        }
        if (bVar3) {
          Abc_UtilsSource(pAbc);
        }
        if ((bVar4) && (pcVar11 != (char *)0x0)) {
          sprintf((char *)local_8038,"%s %s",local_8428,pcVar11);
          iVar9 = Cmd_CommandExecute(pAbc,(char *)local_8038);
          if (iVar9 == 0) goto LAB_001cab37;
        }
        else {
LAB_001cab37:
          iVar9 = Cmd_CommandExecute(pAbc,p->pArray);
          if ((local_8820 != (char *)0x0 && bVar5) && iVar9 + 1U < 2) {
            sprintf((char *)local_8038,"%s %s",local_8818,local_8820);
            Cmd_CommandExecute(pAbc,(char *)local_8038);
          }
        }
        if ((iVar8 != 4) && (iVar8 != 2)) {
          if (p->pArray != (char *)0x0) {
            free(p->pArray);
          }
          free(p);
          goto LAB_001cac23;
        }
        pAbc->fBatchMode = 0;
      }
    }
    if (p->pArray != (char *)0x0) {
      free(p->pArray);
    }
    free(p);
    Abc_UtilsPrintHello(pAbc);
    Cmd_HistoryPrint(pAbc,10);
    if (bVar3) {
      Abc_UtilsSource(pAbc);
    }
    goto LAB_001cabe7;
  }
  goto switchD_001c9f22_caseD_65;
code_r0x001c9f12:
  bVar6 = false;
  switch(iVar7) {
  case 0x62:
    Abc_FrameSetBridgeMode();
    bVar6 = bVar3;
    goto switchD_001c9f22_caseD_73;
  case 99:
    iVar8 = p->nSize;
    if (0 < iVar8) {
      lVar17 = 0;
      while( true ) {
        cVar1 = " ; "[lVar17];
        if (iVar8 == p->nCap) {
          if (iVar8 < 0x10) {
            if (p->pArray == (char *)0x0) {
              pcVar11 = (char *)malloc(0x10);
            }
            else {
              pcVar11 = (char *)realloc(p->pArray,0x10);
            }
            p->pArray = pcVar11;
            p->nCap = 0x10;
          }
          else {
            uVar10 = iVar8 * 2;
            if (p->pArray == (char *)0x0) {
              pcVar11 = (char *)malloc((ulong)uVar10);
            }
            else {
              pcVar11 = (char *)realloc(p->pArray,(ulong)uVar10);
            }
            p->pArray = pcVar11;
            p->nCap = uVar10;
          }
        }
        else {
          pcVar11 = p->pArray;
        }
        iVar8 = p->nSize;
        p->nSize = iVar8 + 1;
        pcVar11[iVar8] = cVar1;
        if (lVar17 == 2) break;
        iVar8 = p->nSize;
        lVar17 = lVar17 + 1;
      }
    }
    pcVar11 = globalUtilOptarg;
    sVar12 = strlen(globalUtilOptarg);
    iVar8 = 1;
    bVar6 = bVar3;
    if (0 < (int)(uint)sVar12) {
      uVar15 = 0;
      do {
        cVar1 = pcVar11[uVar15];
        uVar10 = p->nSize;
        if (uVar10 == p->nCap) {
          if ((int)uVar10 < 0x10) {
            if (p->pArray == (char *)0x0) {
              pcVar13 = (char *)malloc(0x10);
            }
            else {
              pcVar13 = (char *)realloc(p->pArray,0x10);
            }
            p->pArray = pcVar13;
            p->nCap = 0x10;
          }
          else {
            sVar2 = (ulong)uVar10 * 2;
            if (p->pArray == (char *)0x0) {
              pcVar13 = (char *)malloc(sVar2);
            }
            else {
              pcVar13 = (char *)realloc(p->pArray,sVar2);
            }
            p->pArray = pcVar13;
            p->nCap = (int)sVar2;
          }
        }
        else {
          pcVar13 = p->pArray;
        }
        iVar9 = p->nSize;
        p->nSize = iVar9 + 1;
        pcVar13[iVar9] = cVar1;
        uVar15 = uVar15 + 1;
      } while (((uint)sVar12 & 0x7fffffff) != uVar15);
    }
    goto switchD_001c9f22_caseD_73;
  case 100:
    enable_dbg_outs._0_1_ = (byte)enable_dbg_outs ^ 1;
    bVar6 = bVar3;
    goto switchD_001c9f22_caseD_73;
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x70:
  case 0x72:
  case 0x75:
  case 0x76:
  case 0x77:
    goto switchD_001c9f22_caseD_65;
  case 0x66:
    iVar8 = p->nSize;
    if (0 < iVar8) {
      lVar17 = 0;
      while( true ) {
        cVar1 = " ; "[lVar17];
        if (iVar8 == p->nCap) {
          if (iVar8 < 0x10) {
            if (p->pArray == (char *)0x0) {
              pcVar11 = (char *)malloc(0x10);
            }
            else {
              pcVar11 = (char *)realloc(p->pArray,0x10);
            }
            p->pArray = pcVar11;
            p->nCap = 0x10;
          }
          else {
            uVar10 = iVar8 * 2;
            if (p->pArray == (char *)0x0) {
              pcVar11 = (char *)malloc((ulong)uVar10);
            }
            else {
              pcVar11 = (char *)realloc(p->pArray,(ulong)uVar10);
            }
            p->pArray = pcVar11;
            p->nCap = uVar10;
          }
        }
        else {
          pcVar11 = p->pArray;
        }
        iVar8 = p->nSize;
        p->nSize = iVar8 + 1;
        pcVar11[iVar8] = cVar1;
        if (lVar17 == 2) break;
        iVar8 = p->nSize;
        lVar17 = lVar17 + 1;
      }
    }
    pcVar11 = "source %s";
LAB_001ca79a:
    Vec_StrPrintF(p,pcVar11,globalUtilOptarg);
    iVar8 = 1;
    bVar6 = bVar3;
    goto switchD_001c9f22_caseD_73;
  case 0x6c:
    uVar10 = atoi(globalUtilOptarg);
    printf("Limiting time to %d seconds\n",(ulong)uVar10);
    __resource = RLIMIT_CPU;
    local_8038[0].rlim_max = (long)(int)uVar10;
    break;
  case 0x6d:
    uVar10 = atoi(globalUtilOptarg);
    printf("Limiting memory use to %d MB\n",(ulong)uVar10);
    __resource = RLIMIT_AS;
    local_8038[0].rlim_max = (long)(int)uVar10 << 0x14;
    break;
  case 0x6f:
    local_8820 = globalUtilOptarg;
    bVar5 = true;
    bVar6 = bVar3;
    goto switchD_001c9f22_caseD_73;
  case 0x71:
    iVar8 = p->nSize;
    if (0 < iVar8) {
      lVar17 = 0;
      while( true ) {
        cVar1 = " ; "[lVar17];
        if (iVar8 == p->nCap) {
          if (iVar8 < 0x10) {
            if (p->pArray == (char *)0x0) {
              pcVar11 = (char *)malloc(0x10);
            }
            else {
              pcVar11 = (char *)realloc(p->pArray,0x10);
            }
            p->pArray = pcVar11;
            p->nCap = 0x10;
          }
          else {
            uVar10 = iVar8 * 2;
            if (p->pArray == (char *)0x0) {
              pcVar11 = (char *)malloc((ulong)uVar10);
            }
            else {
              pcVar11 = (char *)realloc(p->pArray,(ulong)uVar10);
            }
            p->pArray = pcVar11;
            p->nCap = uVar10;
          }
        }
        else {
          pcVar11 = p->pArray;
        }
        iVar8 = p->nSize;
        p->nSize = iVar8 + 1;
        pcVar11[iVar8] = cVar1;
        if (lVar17 == 2) break;
        iVar8 = p->nSize;
        lVar17 = lVar17 + 1;
      }
    }
    pcVar11 = globalUtilOptarg;
    sVar12 = strlen(globalUtilOptarg);
    iVar8 = 3;
    bVar6 = bVar3;
    if (0 < (int)(uint)sVar12) {
      uVar15 = 0;
      do {
        cVar1 = pcVar11[uVar15];
        uVar10 = p->nSize;
        if (uVar10 == p->nCap) {
          if ((int)uVar10 < 0x10) {
            if (p->pArray == (char *)0x0) {
              pcVar13 = (char *)malloc(0x10);
            }
            else {
              pcVar13 = (char *)realloc(p->pArray,0x10);
            }
            p->pArray = pcVar13;
            p->nCap = 0x10;
          }
          else {
            sVar2 = (ulong)uVar10 * 2;
            if (p->pArray == (char *)0x0) {
              pcVar13 = (char *)malloc(sVar2);
            }
            else {
              pcVar13 = (char *)realloc(p->pArray,sVar2);
            }
            p->pArray = pcVar13;
            p->nCap = (int)sVar2;
          }
        }
        else {
          pcVar13 = p->pArray;
        }
        iVar9 = p->nSize;
        p->nSize = iVar9 + 1;
        pcVar13[iVar9] = cVar1;
        uVar15 = uVar15 + 1;
      } while (((uint)sVar12 & 0x7fffffff) != uVar15);
    }
  case 0x73:
    goto switchD_001c9f22_caseD_73;
  case 0x74:
    iVar8 = TypeCheck(pAbc,globalUtilOptarg);
    pcVar11 = globalUtilOptarg;
    if (iVar8 == 0) goto switchD_001c9f22_caseD_65;
    iVar9 = strcmp(globalUtilOptarg,"none");
    iVar8 = 1;
    bVar6 = bVar3;
    if (iVar9 == 0) goto switchD_001c9f22_caseD_73;
    sprintf(local_8428,"read_%s",pcVar11);
    bVar4 = true;
    goto LAB_001ca55c;
  case 0x78:
    iVar8 = 1;
    bVar4 = false;
    bVar5 = false;
    bVar6 = bVar3;
    goto switchD_001c9f22_caseD_73;
  default:
    if (iVar7 == 0x53) {
      iVar8 = p->nSize;
      if (0 < iVar8) {
        lVar17 = 0;
        while( true ) {
          cVar1 = " ; "[lVar17];
          if (iVar8 == p->nCap) {
            if (iVar8 < 0x10) {
              if (p->pArray == (char *)0x0) {
                pcVar11 = (char *)malloc(0x10);
              }
              else {
                pcVar11 = (char *)realloc(p->pArray,0x10);
              }
              p->pArray = pcVar11;
              p->nCap = 0x10;
            }
            else {
              uVar10 = iVar8 * 2;
              if (p->pArray == (char *)0x0) {
                pcVar11 = (char *)malloc((ulong)uVar10);
              }
              else {
                pcVar11 = (char *)realloc(p->pArray,(ulong)uVar10);
              }
              p->pArray = pcVar11;
              p->nCap = uVar10;
            }
          }
          else {
            pcVar11 = p->pArray;
          }
          iVar8 = p->nSize;
          p->nSize = iVar8 + 1;
          pcVar11[iVar8] = cVar1;
          if (lVar17 == 2) break;
          iVar8 = p->nSize;
          lVar17 = lVar17 + 1;
        }
      }
      pcVar11 = globalUtilOptarg;
      sVar12 = strlen(globalUtilOptarg);
      iVar8 = 5;
      bVar6 = bVar3;
      if (0 < (int)(uint)sVar12) {
        uVar15 = 0;
        do {
          cVar1 = pcVar11[uVar15];
          uVar10 = p->nSize;
          if (uVar10 == p->nCap) {
            if ((int)uVar10 < 0x10) {
              if (p->pArray == (char *)0x0) {
                pcVar13 = (char *)malloc(0x10);
              }
              else {
                pcVar13 = (char *)realloc(p->pArray,0x10);
              }
              p->pArray = pcVar13;
              p->nCap = 0x10;
            }
            else {
              sVar2 = (ulong)uVar10 * 2;
              if (p->pArray == (char *)0x0) {
                pcVar13 = (char *)malloc(sVar2);
              }
              else {
                pcVar13 = (char *)realloc(p->pArray,sVar2);
              }
              p->pArray = pcVar13;
              p->nCap = (int)sVar2;
            }
          }
          else {
            pcVar13 = p->pArray;
          }
          iVar9 = p->nSize;
          p->nSize = iVar9 + 1;
          pcVar13[iVar9] = cVar1;
          uVar15 = uVar15 + 1;
        } while (((uint)sVar12 & 0x7fffffff) != uVar15);
      }
      goto switchD_001c9f22_caseD_73;
    }
    if ((iVar7 != 0x54) ||
       (iVar8 = TypeCheck(pAbc,globalUtilOptarg), pcVar11 = globalUtilOptarg, iVar8 == 0))
    goto switchD_001c9f22_caseD_65;
    iVar9 = strcmp(globalUtilOptarg,"none");
    iVar8 = 1;
    bVar6 = bVar3;
    if (iVar9 == 0) goto switchD_001c9f22_caseD_73;
    sprintf(local_8818,"write_%s",pcVar11);
    bVar5 = true;
LAB_001ca55c:
    iVar8 = 1;
    bVar6 = bVar3;
    goto switchD_001c9f22_caseD_73;
  }
  local_8038[0].rlim_cur = local_8038[0].rlim_max;
  setrlimit(__resource,local_8038);
  bVar6 = bVar3;
  goto switchD_001c9f22_caseD_73;
switchD_001c9f22_caseD_65:
  Abc_UtilsPrintHello(pAbc);
  Abc_UtilsPrintUsage(pAbc,*argv);
  return 1;
  while( true ) {
    pcVar11 = Abc_UtilsGetUsersInput(pAbc);
    uVar10 = Cmd_CommandExecute(pAbc,pcVar11);
    if (0xfffffffd < uVar10) break;
LAB_001cabe7:
    iVar8 = feof(_stdin);
    if (iVar8 != 0) break;
  }
LAB_001cac23:
  Abc_Stop();
  return 0;
}

Assistant:

int Abc_RealMain( int argc, char * argv[] )
{
    Abc_Frame_t * pAbc;
    Vec_Str_t* sCommandUsr = Vec_StrAlloc(1000);
    char sCommandTmp[ABC_MAX_STR], sReadCmd[1000], sWriteCmd[1000];
    const char * sOutFile, * sInFile;
    char * sCommand;
    int  fStatus = 0;
    int c, fInitSource, fInitRead, fFinalWrite;

    enum {
        INTERACTIVE, // interactive mode
        BATCH, // batch mode, run a command and quit
        BATCH_THEN_INTERACTIVE, // run a command, then back to interactive mode
        BATCH_QUIET, // as in batch mode, but don't echo the command
        BATCH_QUIET_THEN_INTERACTIVE, // as in batch then interactive mode, but don't echo the command
        BATCH_SMT // special batch mode, which expends SMTLIB problem via stdin
    } fBatch;

    // added to detect memory leaks
    // watch for {,,msvcrtd.dll}*__p__crtBreakAlloc()
    // (http://support.microsoft.com/kb/151585)
#if defined(_DEBUG) && defined(_MSC_VER)
    _CrtSetDbgFlag( _CRTDBG_ALLOC_MEM_DF | _CRTDBG_LEAK_CHECK_DF );
#endif

    // get global frame (singleton pattern)
    // will be initialized on first call
    pAbc = Abc_FrameGetGlobalFrame();
    pAbc->sBinary = argv[0];

    // default options
    fBatch      = INTERACTIVE;
    fInitSource = 1;
    fInitRead   = 0;
    fFinalWrite = 0;
    sInFile = sOutFile = NULL;
    sprintf( sReadCmd,  "read"  );
    sprintf( sWriteCmd, "write" );

    Extra_UtilGetoptReset();
    while ((c = Extra_UtilGetopt(argc, argv, "dm:l:c:q:C:Q:S:hf:F:o:st:T:xb")) != EOF) {
        switch(c) {

            case 'd':                                          
                enable_dbg_outs ^= 1;                            
                break;                                          

            case 'm': {
#if !defined(WIN32) && !defined(ABC_NO_RLIMIT)
                int maxMb = atoi(globalUtilOptarg);             
                printf("Limiting memory use to %d MB\n", maxMb);
                struct rlimit limit = {                         
                    maxMb * (1llu << 20), /* soft limit */      
                    maxMb * (1llu << 20)  /* hard limit */      
                };                                              
                setrlimit(RLIMIT_AS, &limit);                   
#endif
                break; 
            }                                         
            case 'l': {
#if !defined(WIN32) && !defined(ABC_NO_RLIMIT)
                rlim_t maxTime = atoi(globalUtilOptarg);           
                printf("Limiting time to %d seconds\n", (int)maxTime);
                struct rlimit limit = {                         
                    maxTime,             /* soft limit */       
                    maxTime              /* hard limit */       
                };                                              
                setrlimit(RLIMIT_CPU, &limit);                  
#endif
                break; 
            }                                         
            case 'c':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrAppend(sCommandUsr, globalUtilOptarg );
                fBatch = BATCH;
                break;

            case 'q':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrAppend(sCommandUsr, globalUtilOptarg );
                fBatch = BATCH_QUIET;
                break;

            case 'Q':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrAppend(sCommandUsr, globalUtilOptarg );
                fBatch = BATCH_QUIET_THEN_INTERACTIVE;
                break;

            case 'C':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrAppend(sCommandUsr, globalUtilOptarg );
                fBatch = BATCH_THEN_INTERACTIVE;
                break;

            case 'S':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrAppend(sCommandUsr, globalUtilOptarg );
                fBatch = BATCH_SMT;
                break;

            case 'f':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrPrintF(sCommandUsr, "source %s", globalUtilOptarg );
                fBatch = BATCH;
                break;

            case 'F':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrPrintF(sCommandUsr, "source -x %s", globalUtilOptarg );
                fBatch = BATCH;
                break;

            case 'h':
                goto usage;
                break;

            case 'o':
                sOutFile = globalUtilOptarg;
                fFinalWrite = 1;
                break;

            case 's':
                fInitSource = 0;
                break;

            case 't':
                if ( TypeCheck( pAbc, globalUtilOptarg ) )
                {
                    if ( (!strcmp(globalUtilOptarg, "none")) == 0 )
                    {
                        fInitRead = 1;
                        sprintf( sReadCmd, "read_%s", globalUtilOptarg );
                    }
                }
                else {
                    goto usage;
                }
                fBatch = BATCH;
                break;

            case 'T':
                if ( TypeCheck( pAbc, globalUtilOptarg ) )
                {
                    if ( (!strcmp(globalUtilOptarg, "none")) == 0)
                    {
                        fFinalWrite = 1;
                        sprintf( sWriteCmd, "write_%s", globalUtilOptarg);
                    }
                }
                else {
                    goto usage;
                }
                fBatch = BATCH;
                break;

            case 'x':
                fFinalWrite = 0;
                fInitRead   = 0;
                fBatch = BATCH;
                break;

            case 'b':
                Abc_FrameSetBridgeMode();
                break;

            default:
                goto usage;
        }
    }

    Vec_StrPush(sCommandUsr, '\0');

    if ( fBatch == BATCH_SMT )
    {
        Wlc_StdinProcessSmt( pAbc, Vec_StrArray(sCommandUsr) );
        Abc_Stop();
        return 0;
    }

    if ( Abc_FrameIsBridgeMode() )
    {
        extern Gia_Man_t * Gia_ManFromBridge( FILE * pFile, Vec_Int_t ** pvInit );
        pAbc->pGia = Gia_ManFromBridge( stdin, NULL );
    }
    else if ( fBatch!=INTERACTIVE && fBatch!=BATCH_QUIET && fBatch!=BATCH_QUIET_THEN_INTERACTIVE && Vec_StrSize(sCommandUsr)>0 )
        Abc_Print( 1, "ABC command line: \"%s\".\n\n", Vec_StrArray(sCommandUsr) );

    if ( fBatch!=INTERACTIVE )
    {
        pAbc->fBatchMode = 1;

        if (argc - globalUtilOptind == 0)
        {
            sInFile = NULL;
        }
        else if (argc - globalUtilOptind == 1)
        {
            fInitRead = 1;
            sInFile = argv[globalUtilOptind];
        }
        else
        {
            Abc_UtilsPrintUsage( pAbc, argv[0] );
        }

        // source the resource file
        if ( fInitSource )
        {
            Abc_UtilsSource( pAbc );
        }

        fStatus = 0;
        if ( fInitRead && sInFile )
        {
            sprintf( sCommandTmp, "%s %s", sReadCmd, sInFile );
            fStatus = Cmd_CommandExecute( pAbc, sCommandTmp );
        }

        if ( fStatus == 0 )
        {
            /* cmd line contains `source <file>' */
            fStatus = Cmd_CommandExecute( pAbc, Vec_StrArray(sCommandUsr) );
            if ( (fStatus == 0 || fStatus == -1) && fFinalWrite && sOutFile )
            {
                sprintf( sCommandTmp, "%s %s", sWriteCmd, sOutFile );
                fStatus = Cmd_CommandExecute( pAbc, sCommandTmp );
            }
        }

        if (fBatch == BATCH_THEN_INTERACTIVE || fBatch == BATCH_QUIET_THEN_INTERACTIVE){
            fBatch = INTERACTIVE;
            pAbc->fBatchMode = 0;
        }
    }

    Vec_StrFreeP(&sCommandUsr);

    if ( fBatch==INTERACTIVE )
    {
        // start interactive mode

        // print the hello line
        Abc_UtilsPrintHello( pAbc );
        // print history of the recent commands
        Cmd_HistoryPrint( pAbc, 10 );

        // source the resource file
        if ( fInitSource )
        {
            Abc_UtilsSource( pAbc );
        }

        // execute commands given by the user
        while ( !feof(stdin) )
        {
            // print command line prompt and
            // get the command from the user
            sCommand = Abc_UtilsGetUsersInput( pAbc );

            // execute the user's command
            fStatus = Cmd_CommandExecute( pAbc, sCommand );

            // stop if the user quitted or an error occurred
            if ( fStatus == -1 || fStatus == -2 )
                break;
        }
    }

    // if the memory should be freed, quit packages
//    if ( fStatus < 0 ) 
    {
        Abc_Stop();
    }
    return 0;

usage:
    Abc_UtilsPrintHello( pAbc );
    Abc_UtilsPrintUsage( pAbc, argv[0] );
    return 1;
}